

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test::
ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test
          (ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test *this)

{
  ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test_0299fa50;
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenaAndNonArenaUsingReflection) {
  TestAllTypes non_arena_message;
  TestUtil::SetAllFields(&non_arena_message);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    const Reflection* r = arena2_message->GetReflection();
    r->Swap(&non_arena_message, arena2_message);
    TestUtil::ExpectAllFieldsSet(*arena2_message);
    TestUtil::ExpectAllFieldsSet(non_arena_message);
  }
}